

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppgenerator.cpp
# Opt level: O1

void __thiscall CppGenerator::generateDecl(CppGenerator *this,QTextStream *out)

{
  Grammar *pGVar1;
  long lVar2;
  Grammar *pGVar3;
  char cVar4;
  QTextStream *pQVar5;
  _List_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  char *pcVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  int iVar11;
  long in_FS_OFFSET;
  QStringView QVar12;
  QStringView QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QTextStream *)QTextStream::operator<<(out,"class ");
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,&this->grammar->table_name);
  pQVar5 = (QTextStream *)Qt::endl(pQVar5);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"{");
  pQVar5 = (QTextStream *)Qt::endl(pQVar5);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"public:");
  pQVar5 = (QTextStream *)Qt::endl(pQVar5);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"    enum VariousConstants {");
  Qt::endl(pQVar5);
  pGVar1 = this->grammar;
  p_Var7 = (pGVar1->terminals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var7 == &(pGVar1->terminals)._M_t._M_impl.super__Rb_tree_header) {
      pQVar5 = (QTextStream *)Qt::endl(out);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"        ACCEPT_STATE = ");
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,this->accept_state);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,",");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"        RULE_COUNT = ");
      pQVar5 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar5,(this->grammar->rules).
                                 super__List_base<Rule,_std::allocator<Rule>_>._M_impl._M_node.
                                 _M_size);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,",");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"        STATE_COUNT = ");
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,this->state_count);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,",");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"        TERMINAL_COUNT = ");
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,this->terminal_count);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,",");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"        NON_TERMINAL_COUNT = ");
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,this->non_terminal_count);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,",");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"        GOTO_INDEX_OFFSET = ");
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(this->compressed_action).index.d.size)
      ;
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,",");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"        GOTO_INFO_OFFSET = ");
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(this->compressed_action).info.d.size);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,",");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"        GOTO_CHECK_OFFSET = ");
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(this->compressed_action).check.d.size)
      ;
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"    };");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"    static const char *const     spell[];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"    static const short             lhs[];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"    static const short             rhs[];");
      Qt::endl(pQVar5);
      if (this->debug_info != false) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        debugInfoProt(&local_58,this);
        pQVar5 = (QTextStream *)Qt::endl(out);
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"#ifndef ");
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,&local_58);
        pQVar5 = (QTextStream *)Qt::endl(pQVar5);
        pQVar5 = (QTextStream *)
                 QTextStream::operator<<(pQVar5,"    static const int     rule_index[];");
        pQVar5 = (QTextStream *)Qt::endl(pQVar5);
        pQVar5 = (QTextStream *)
                 QTextStream::operator<<(pQVar5,"    static const int      rule_info[];");
        pQVar5 = (QTextStream *)Qt::endl(pQVar5);
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"#endif // ");
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,&local_58);
        pQVar5 = (QTextStream *)Qt::endl(pQVar5);
        Qt::endl(pQVar5);
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(out,"    static const short    goto_default[];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"    static const short  action_default[];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"    static const short    action_index[];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"    static const short     action_info[];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"    static const short    action_check[];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"    static inline int nt_action (int state, int nt)")
      ;
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"    {");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar5,
                          "        const int yyn = action_index [GOTO_INDEX_OFFSET + state] + nt;");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar5,
                          "        if (yyn < 0 || action_check [GOTO_CHECK_OFFSET + yyn] != nt)");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"            return goto_default [nt];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar5,"        return action_info [GOTO_INFO_OFFSET + yyn];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"    }");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar5,"    static inline int t_action (int state, int token)");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"    {");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar5,"        const int yyn = action_index [state] + token;");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"        if (yyn < 0 || action_check [yyn] != token)")
      ;
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<(pQVar5,"            return - action_default [state];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"        return action_info [yyn];");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"    }");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"};");
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      pQVar5 = (QTextStream *)Qt::endl(pQVar5);
      Qt::endl(pQVar5);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    lVar2 = *(long *)(p_Var7 + 1);
    local_58.d.d = *(Data **)(lVar2 + 0x10);
    local_58.d.ptr = *(char16_t **)(lVar2 + 0x18);
    local_58.d.size = *(undefined8 *)(lVar2 + 0x20);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pGVar3 = this->grammar;
    iVar11 = 0;
    for (p_Var6 = (pGVar3->names).super__List_base<QString,_std::allocator<QString>_>._M_impl.
                  _M_node.super__List_node_base._M_next; p_Var6 != *(_List_node_base **)(p_Var7 + 1)
        ; p_Var6 = p_Var6->_M_next) {
      iVar11 = iVar11 + 1;
    }
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x7) {
      QVar13.m_data = local_58.d.ptr;
      QVar13.m_size = 7;
      QVar15.m_data = "$accept";
      QVar15.m_size = 7;
      cVar4 = QtPrivate::equalStrings(QVar13,QVar15);
      if (cVar4 == '\0') goto LAB_00107f5c;
      qVar10 = 0xd;
      pcVar8 = "ACCEPT_SYMBOL";
LAB_00107f55:
      QVar16.m_data = pcVar8;
      QVar16.m_size = qVar10;
      QString::operator=(&local_58,QVar16);
    }
    else {
      if (((undefined1 *)local_58.d.size == (undefined1 *)0x4) &&
         (QVar12.m_data = local_58.d.ptr, QVar12.m_size = 4, QVar14.m_data = "$end",
         QVar14.m_size = 4, cVar4 = QtPrivate::equalStrings(QVar12,QVar14), cVar4 != '\0')) {
        qVar10 = 10;
        pcVar8 = "EOF_SYMBOL";
        goto LAB_00107f55;
      }
LAB_00107f5c:
      pcVar9 = (pGVar3->token_prefix).d.ptr;
      if (pcVar9 == (char16_t *)0x0) {
        pcVar9 = (char16_t *)&QString::_empty;
      }
      QString::insert((longlong)&local_58,(QChar *)0x0,(longlong)pcVar9);
    }
    pQVar5 = (QTextStream *)QTextStream::operator<<(out,"        ");
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,&local_58);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," = ");
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,iVar11);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,",");
    Qt::endl(pQVar5);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void CppGenerator::generateDecl (QTextStream &out)
{
  out << "class " << grammar.table_name << Qt::endl
      << "{" << Qt::endl
      << "public:" << Qt::endl
      << "    enum VariousConstants {" << Qt::endl;

  for (const Name &t : std::as_const(grammar.terminals))
    {
      QString name = *t;
      int value = std::distance (grammar.names.begin (), t);

      if (name == "$end"_L1)
        name = "EOF_SYMBOL"_L1;

      else if (name == "$accept"_L1)
        name = "ACCEPT_SYMBOL"_L1;

      else
        name.prepend (grammar.token_prefix);

      out << "        " << name << " = " << value << "," << Qt::endl;
    }

  out << Qt::endl
      << "        ACCEPT_STATE = " << accept_state << "," << Qt::endl
      << "        RULE_COUNT = " << grammar.rules.size () << "," << Qt::endl
      << "        STATE_COUNT = " << state_count << "," << Qt::endl
      << "        TERMINAL_COUNT = " << terminal_count << "," << Qt::endl
      << "        NON_TERMINAL_COUNT = " << non_terminal_count << "," << Qt::endl
      << Qt::endl
      << "        GOTO_INDEX_OFFSET = " << compressed_action.index.size () << "," << Qt::endl
      << "        GOTO_INFO_OFFSET = " << compressed_action.info.size () << "," << Qt::endl
      << "        GOTO_CHECK_OFFSET = " << compressed_action.check.size () << Qt::endl
      << "    };" << Qt::endl
      << Qt::endl
      << "    static const char *const     spell[];" << Qt::endl
      << "    static const short             lhs[];" << Qt::endl
      << "    static const short             rhs[];" << Qt::endl;

  if (debug_info)
    {
      QString prot = debugInfoProt();

      out << Qt::endl << "#ifndef " << prot << Qt::endl
          << "    static const int     rule_index[];" << Qt::endl
          << "    static const int      rule_info[];" << Qt::endl
          << "#endif // " << prot << Qt::endl << Qt::endl;
    }

  out << "    static const short    goto_default[];" << Qt::endl
      << "    static const short  action_default[];" << Qt::endl
      << "    static const short    action_index[];" << Qt::endl
      << "    static const short     action_info[];" << Qt::endl
      << "    static const short    action_check[];" << Qt::endl
      << Qt::endl
      << "    static inline int nt_action (int state, int nt)" << Qt::endl
      << "    {" << Qt::endl
      << "        const int yyn = action_index [GOTO_INDEX_OFFSET + state] + nt;" << Qt::endl
      << "        if (yyn < 0 || action_check [GOTO_CHECK_OFFSET + yyn] != nt)" << Qt::endl
      << "            return goto_default [nt];" << Qt::endl
      << Qt::endl
      << "        return action_info [GOTO_INFO_OFFSET + yyn];" << Qt::endl
      << "    }" << Qt::endl
      << Qt::endl
      << "    static inline int t_action (int state, int token)" << Qt::endl
      << "    {" << Qt::endl
      << "        const int yyn = action_index [state] + token;" << Qt::endl
      << Qt::endl
      << "        if (yyn < 0 || action_check [yyn] != token)" << Qt::endl
      << "            return - action_default [state];" << Qt::endl
      << Qt::endl
      << "        return action_info [yyn];" << Qt::endl
      << "    }" << Qt::endl
      << "};" << Qt::endl
      << Qt::endl
      << Qt::endl;
}